

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O3

int funchook_install(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  uint uVar2;
  ulong uVar3;
  funchook_entry_t *pfVar4;
  funchook_page_t *page;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_install(%p, 0x%x)\n",funchook,flags);
  uVar3 = 2;
  if (funchook->installed == 0) {
    page = funchook->page_list;
    if (page != (funchook_page_t *)0x0) {
      do {
        uVar2 = funchook_page_protect(funchook,page);
        if (uVar2 != 0) {
LAB_0010170f:
          uVar3 = (ulong)uVar2;
          goto LAB_00101711;
        }
        if (page->used != 0) {
          pfVar4 = page->entries;
          uVar3 = 0;
          do {
            uVar2 = funchook_unprotect_begin(funchook,&local_40,pfVar4->target_func,5);
            if (uVar2 != 0) goto LAB_0010170f;
            puVar1 = (undefined4 *)pfVar4->target_func;
            *(uint8_t *)(puVar1 + 1) = pfVar4->new_code[4];
            *puVar1 = *(undefined4 *)pfVar4->new_code;
            uVar2 = funchook_unprotect_end(funchook,&local_40);
            if (uVar2 != 0) goto LAB_0010170f;
            uVar3 = uVar3 + 1;
            pfVar4 = pfVar4 + 1;
          } while (uVar3 < page->used);
        }
        page = page->next;
      } while (page != (funchook_page *)0x0);
    }
    funchook->installed = 1;
    uVar3 = 0;
  }
LAB_00101711:
  funchook_log_end(funchook,"Leave funchook_install() => %d\n",uVar3);
  return (int)uVar3;
}

Assistant:

int funchook_install(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_install(%p, 0x%x)\n", funchook, flags);
    rv = funchook_install_internal(funchook, flags);
    funchook_log_end(funchook, "Leave funchook_install() => %d\n", rv);
    return rv;
}